

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_matrix_matrix_addition_Test::TestBody
          (test_matrix_sparse_matrix_matrix_addition_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  Scalar *pSVar4;
  char *pcVar5;
  DeathTest DVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  DeathTest *gtest_dt;
  undefined1 local_2e8 [32];
  Matrix_Sparse matrix_wrong_size;
  ReturnSentinel gtest_sentinel;
  Matrix_Sparse matrix_result;
  Matrix_Sparse matrix;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_188;
  Matrix_Sparse identity;
  Matrix_Sparse local_120;
  Matrix_Sparse local_d0;
  Matrix_Sparse local_80;
  
  matrix.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  matrix.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  matrix.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matrix.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  value._M_len = 3;
  value._M_array = (iterator)&matrix_wrong_size;
  index._M_len = 3;
  index._M_array = (iterator)&matrix_result;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&matrix;
  Disa::Matrix_Sparse::Matrix_Sparse(&identity,non_zero,index,value,3);
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  matrix_result.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  matrix_wrong_size.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  local_2e8._0_8_ = &DAT_4008000000000000;
  local_2e8._8_8_ = (pointer)0xc010000000000000;
  local_2e8._16_8_ = (pointer)0x4014000000000000;
  value_00._M_len = 3;
  value_00._M_array = (iterator)local_2e8;
  index_00._M_len = 3;
  index_00._M_array = (iterator)&matrix_wrong_size;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)&matrix_result;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix,non_zero_00,index_00,value_00,3);
  matrix_result.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matrix_result.column_size = 0;
  matrix_result.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_result.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matrix_result.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  matrix_result.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matrix_result.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_d0,&identity);
  Disa::operator+(&matrix_wrong_size,&local_d0,&matrix);
  Disa::Matrix_Sparse::operator=(&matrix_result,&matrix_wrong_size);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_wrong_size);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_d0);
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (identity.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      identity.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)identity.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)identity.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"identity.size_row()","3",(unsigned_long *)local_2e8,
             (int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ = identity.column_size;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"identity.size_column()","3",(unsigned_long *)local_2e8,
             (int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ =
       (long)identity.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)identity.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"identity.size_non_zero()","3",
             (unsigned_long *)local_2e8,(int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&identity);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"identity[0][0]","1.0",*pSVar4,1.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,699,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&identity);
  gtest_sentinel.test_ = (DeathTest *)0x1;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"identity[1][1]","1.0",*pSVar4,1.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,700,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&identity);
  gtest_sentinel.test_ = (DeathTest *)0x2;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"identity[2][2]","1.0",*pSVar4,1.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (matrix.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      matrix.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)matrix.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)matrix.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix.size_row()","3",(unsigned_long *)local_2e8,
             (int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2bf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ = matrix.column_size;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix.size_column()","3",(unsigned_long *)local_2e8,
             (int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ =
       (long)matrix.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)matrix.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix.size_non_zero()","3",(unsigned_long *)local_2e8,
             (int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix);
  gtest_sentinel.test_ = (DeathTest *)0x2;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix[0][2]","3.0",*pSVar4,3.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix);
  gtest_sentinel.test_ = (DeathTest *)0x1;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix[1][1]","-4.0",*pSVar4,-4.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix[2][0]","5.0",*pSVar4,5.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      matrix_result.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2e8._0_8_ =
         ((long)matrix_result.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)matrix_result.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix_result.size_row()","3",
             (unsigned_long *)local_2e8,(int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ = matrix_result.column_size;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix_result.size_column()","3",
             (unsigned_long *)local_2e8,(int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._0_8_ =
       (long)matrix_result.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)matrix_result.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  gtest_dt = (DeathTest *)CONCAT44(gtest_dt._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&matrix_wrong_size,"matrix_result.size_non_zero()","5",
             (unsigned_long *)local_2e8,(int *)&gtest_dt);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix_result);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix_result[0][0]","1.0",*pSVar4,1.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_2e8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix_result);
  gtest_sentinel.test_ = (DeathTest *)0x2;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix_result[0][2]","3.0",*pSVar4,3.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2ca,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2e8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix_result);
  gtest_sentinel.test_ = (DeathTest *)0x1;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix_result[1][1]","-3.0",*pSVar4,-3.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix_result);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix_result[2][0]","5.0",*pSVar4,5.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_2e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_dt = (DeathTest *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2e8,(size_t *)&matrix_result);
  gtest_sentinel.test_ = (DeathTest *)0x2;
  pSVar4 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2e8,(size_t *)&gtest_sentinel)
  ;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&matrix_wrong_size,"matrix_result[2][2]","1.0",*pSVar4,1.0);
  if ((char)matrix_wrong_size.row_non_zero.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)local_2e8);
    if (matrix_wrong_size.row_non_zero.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*matrix_wrong_size.row_non_zero.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2cd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2e8._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&matrix_wrong_size.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_2e8._16_8_ = (pointer)0x2;
  local_2e8._24_8_ = (pointer)0x3;
  local_2e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_2e8._8_8_ = (pointer)0x1;
  gtest_dt = (DeathTest *)0x2;
  pcVar5 = (char *)0x1;
  gtest_sentinel.test_ = (DeathTest *)&DAT_4008000000000000;
  value_01._M_len = 3;
  value_01._M_array = (iterator)&gtest_sentinel;
  index_01._M_len = 3;
  index_01._M_array = (iterator)&gtest_dt;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = (iterator)local_2e8;
  Disa::Matrix_Sparse::Matrix_Sparse(&matrix_wrong_size,non_zero_01,index_01,value_01,4);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(pcVar5);
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix + matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_188,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x2d0,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_188);
    pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00125861;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_001258b5;
    iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    pDVar1 = gtest_dt;
    if (iVar3 == 0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
      iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (*((DeathTest *)pbVar7)->_vptr_DeathTest[1])(pbVar7);
        goto LAB_00125861;
      }
    }
    else if (iVar3 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        Disa::Matrix_Sparse::Matrix_Sparse(&local_120,&matrix);
        Disa::operator+(&local_80,&local_120,&matrix_wrong_size);
        Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
        Disa::Matrix_Sparse::~Matrix_Sparse(&local_120);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    DVar6 = (DeathTest)((DeathTest *)pbVar7)->_vptr_DeathTest;
  }
  else {
LAB_00125861:
    testing::Message::Message((Message *)local_2e8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2d0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8._0_8_
        == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001258b5;
    DVar6._vptr_DeathTest = *(_func_int ***)local_2e8._0_8_;
    pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_2e8._0_8_;
  }
  (*DVar6._vptr_DeathTest[1])(pbVar7);
LAB_001258b5:
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_wrong_size);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix_result);
  Disa::Matrix_Sparse::~Matrix_Sparse(&matrix);
  Disa::Matrix_Sparse::~Matrix_Sparse(&identity);
  return;
}

Assistant:

TEST(test_matrix_sparse, matrix_matrix_addition) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result;
  matrix_result = identity + matrix;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(identity[0][0], 1.0);
  EXPECT_DOUBLE_EQ(identity[1][1], 1.0);
  EXPECT_DOUBLE_EQ(identity[2][2], 1.0);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -4.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix_result[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_result[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][1], -3.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix_result[2][2], 1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix + matrix_wrong_size, "./*");
}